

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O1

void __thiscall tt::net::Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  int iVar4;
  HttpData *__tmp;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  undefined1 local_4c [8];
  epoll_event event;
  
  iVar3 = Channel::getFd((request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr);
  if (0 < timeout) {
    event.data = (epoll_data_t)
                 (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    add_timer(this,(SP_Channel *)&event.data,timeout);
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    peVar2 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = (peVar2->m_holder).super___weak_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = p_Var6->_M_use_count;
      do {
        if (iVar4 == 0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = p_Var6->_M_use_count;
        bVar7 = iVar4 == iVar1;
        if (bVar7) {
          p_Var6->_M_use_count = iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar7);
    }
    if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = p_Var6->_M_use_count == 0;
    }
    if (bVar7) {
      peVar5 = (element_type *)0x0;
    }
    else {
      peVar5 = (peVar2->m_holder).super___weak_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    this->m_fd2http[iVar3].super___shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar5;
    this_00 = this->m_fd2http[iVar3].
              super___shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this->m_fd2http[iVar3].super___shared_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  peVar2 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_4c._0_4_ = peVar2->m_events;
  peVar2->m_lastEvents = local_4c._0_4_;
  this->m_fd2chan[iVar3].super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  local_4c._4_4_ = iVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&this->m_fd2chan[iVar3].
              super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  iVar3 = epoll_ctl(this->m_epollFd,1,iVar3,(epoll_event *)local_4c);
  if (iVar3 < 0) {
    epoll_add();
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
	
	int fd = request->getFd();

	if(timeout > 0){
		add_timer(request, timeout);
		m_fd2http[fd] = request->getHolder();
	}


	struct epoll_event event;
	
	event.data.fd = fd;
	event.events  =request->getEvents();
	
	request->EqualAndUpdateLastEvents();
	m_fd2chan[fd] = request;

	if(epoll_ctl(m_epollFd, EPOLL_CTL_ADD, fd, &event) < 0){
		perror("epoll_add error");
		m_fd2chan[fd].reset();
	}

}